

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_DebugStringReservedRangeMax_Test::
TestBody(ValidationErrorTest_DebugStringReservedRangeMax_Test *this)

{
  FileDescriptor *this_00;
  char *message;
  Arg *in_R9;
  string_view format;
  string_view file_text;
  string local_a0;
  Arg local_80;
  AssertionResult gtest_ar;
  
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_80,0x7fffffff);
  absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)&gtest_ar,0x20000000);
  format._M_str = (char *)&local_80;
  format._M_len =
       (size_t)
       "name: \"foo.proto\" enum_type {   name: \"Bar\"  value { name:\"BAR\" number:1 }  reserved_range { start: 5 end: $0 }}message_type {  name: \"Foo\"  reserved_range { start: 5 end: $1 }}"
  ;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_a0,(lts_20250127 *)0xb1,format,(Arg *)&gtest_ar,in_R9);
  file_text._M_str = local_a0._M_dataplus._M_p;
  file_text._M_len = local_a0._M_string_length;
  this_00 = ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
  std::__cxx11::string::~string((string *)&local_a0);
  FileDescriptor::DebugString_abi_cxx11_((string *)&local_80,this_00);
  testing::internal::CmpHelperEQ<char[105],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"syntax = \\\"proto2\\\";\\n\\n\" \"enum Bar {\\n\" \"  BAR = 1;\\n\" \"  reserved 5 to max;\\n\" \"}\\n\\n\" \"message Foo {\\n\" \"  reserved 5 to max;\\n\" \"}\\n\\n\""
             ,"file->DebugString()",
             (char (*) [105])
             "syntax = \"proto2\";\n\nenum Bar {\n  BAR = 1;\n  reserved 5 to max;\n}\n\nmessage Foo {\n  reserved 5 to max;\n}\n\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x13be,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((long *)local_80.piece_._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_80.piece_._M_len + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, DebugStringReservedRangeMax) {
  const FileDescriptor* file = BuildFile(absl::Substitute(
      "name: \"foo.proto\" "
      "enum_type { "
      "  name: \"Bar\""
      "  value { name:\"BAR\" number:1 }"
      "  reserved_range { start: 5 end: $0 }"
      "}"
      "message_type {"
      "  name: \"Foo\""
      "  reserved_range { start: 5 end: $1 }"
      "}",
      std::numeric_limits<int>::max(), FieldDescriptor::kMaxNumber + 1));

  ASSERT_EQ(
      "syntax = \"proto2\";\n\n"
      "enum Bar {\n"
      "  BAR = 1;\n"
      "  reserved 5 to max;\n"
      "}\n\n"
      "message Foo {\n"
      "  reserved 5 to max;\n"
      "}\n\n",
      file->DebugString());
}